

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistoryTree.cpp
# Opt level: O0

void __thiscall JointActionObservationHistoryTree::Print(JointActionObservationHistoryTree *this)

{
  bool bVar1;
  const_iterator this_00;
  reference __p;
  undefined8 uVar2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>
  *in_RDI;
  JointActionObservationHistoryTree *suc_jaoht;
  TreeNode<JointActionObservationHistory> *suc_tn;
  pair<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*> p;
  const_iterator it;
  map<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>_>
  *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  TreeNode<JointActionObservationHistory> *this_01;
  pair<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*> local_28;
  _Self local_18;
  
  if (*(int *)&in_RDI[0xb]._M_node == 0) {
    if (in_RDI[10]._M_node == (_Base_ptr)0x0) {
      return;
    }
    std::operator<<((ostream *)&std::cout,"index: ");
    if (((ulong)in_RDI[9]._M_node & 1) == 0) {
      std::operator<<((ostream *)&std::cout,"INVALID");
    }
    else {
      std::ostream::operator<<(&std::cout,(ulonglong)in_RDI[8]._M_node);
    }
    std::operator<<((ostream *)&std::cout," - ");
    (**(code **)(*(long *)in_RDI[10]._M_node + 0x18))();
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  this_00 = std::
            map<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>_>
            ::begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffff0,&local_18);
    if (!bVar1) {
      return;
    }
    __p = std::
          _Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>
          ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>
                       *)0x9b1dd3);
    std::pair<unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>::
    pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*,_true>(&local_28,__p);
    if (local_28.second == (TreeNode<JointActionObservationHistory> *)0x0) break;
    Print((JointActionObservationHistoryTree *)this_00._M_node);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointActionObservationHistory>_*>_>
    ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  this_01 = local_28.second;
  uVar2 = __cxa_allocate_exception(0x28);
  E::E((E *)this_01,(char *)local_28.second);
  __cxa_throw(uVar2,&E::typeinfo,E::~E);
}

Assistant:

void JointActionObservationHistoryTree::Print() const
{
    if(_m_nodeType == A_SUC)
    {
        if(_m_containedElem == 0)
            return;    

        cout << "index: ";
        if(_m_indexValid)
            cout<< _m_index;
        else
            cout << "INVALID";
        cout << " - ";
        _m_containedElem->Print();
        cout <<endl;
        
    }
    //in both cases (also if _m_nodeType == O_SUC)
    
    map< LIndex, TreeNode<JointActionObservationHistory>*>::const_iterator
        it = _m_successor.begin();
    while(it != _m_successor.end())
    {
        pair< LIndex, TreeNode<JointActionObservationHistory>*> p = *it;
        TreeNode<JointActionObservationHistory>* suc_tn = p.second;
        //we only put JointActionObservationHistoryTree's as successors, so
        //we can do this:
        JointActionObservationHistoryTree* suc_jaoht =
            static_cast<JointActionObservationHistoryTree*>(suc_tn);
        if(suc_jaoht != 0)
            suc_jaoht->Print();
        else
            throw E("JointActionObservationHistoryTree::Print() - encountered"\
"a successor of this JointActionObservationHistoryTree that is 0 (NULL) ");

        it++;
    }
}